

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EthBasePort.cpp
# Opt level: O0

void __thiscall EthBasePort::ProcessExtraData(EthBasePort *this,uchar *packet)

{
  __uint16_t _Var1;
  uint uVar2;
  unsigned_short *packetW;
  double FPGA_sysclk_MHz;
  uint FwBusGeneration_FPGA;
  uchar *packet_local;
  EthBasePort *this_local;
  
  (this->FpgaStatus).FwBusReset = (*packet & 1) != 0;
  (this->FpgaStatus).FwPacketDropped = (*packet & 2) != 0;
  (this->FpgaStatus).EthInternalError = (*packet & 4) != 0;
  (this->FpgaStatus).EthSummaryError = (*packet & 8) != 0;
  (this->FpgaStatus).noForwardFlag = (*packet & 0x10) != 0;
  (this->FpgaStatus).srcPort = (int)(*packet & 0x60) >> 5;
  (this->FpgaStatus).numStateInvalid = (uint)packet[2];
  (this->FpgaStatus).numPacketError = (uint)packet[3];
  uVar2 = (uint)packet[1];
  _Var1 = __bswap_16(*(__uint16_t *)(packet + 4));
  this->FPGA_RecvTime = (double)_Var1 / 49152000.0;
  _Var1 = __bswap_16(*(__uint16_t *)(packet + 6));
  this->FPGA_TotalTime = (double)_Var1 / 49152000.0;
  (this->super_BasePort).newFwBusGeneration = uVar2;
  if ((uVar2 != (this->super_BasePort).FwBusGeneration) &&
     (((this->FpgaStatus).noForwardFlag & 1U) == 0)) {
    (*(this->super_BasePort)._vptr_BasePort[0x30])(this,(ulong)uVar2);
  }
  return;
}

Assistant:

void EthBasePort::ProcessExtraData(const unsigned char *packet)
{
    FpgaStatus.FwBusReset = (packet[0]&FwBusReset);
    FpgaStatus.FwPacketDropped = (packet[0]&FwPacketDropped);
    FpgaStatus.EthInternalError = (packet[0]&EthInternalError);
    FpgaStatus.EthSummaryError = (packet[0]&EthSummaryError);
    FpgaStatus.noForwardFlag = (packet[0]&noForwardFlag);
    FpgaStatus.srcPort = (packet[0]&srcPortMask)>>srcPortShift;
    FpgaStatus.numStateInvalid = packet[2];
    FpgaStatus.numPacketError = packet[3];
    unsigned int FwBusGeneration_FPGA = packet[1];

    const double FPGA_sysclk_MHz = 49.152;      /* FPGA sysclk in MHz (from AmpIO.cpp) */
    const unsigned short *packetW = reinterpret_cast<const unsigned short *>(packet);
    FPGA_RecvTime = bswap_16(packetW[2])/(FPGA_sysclk_MHz*1.0e6);
    FPGA_TotalTime = bswap_16(packetW[3])/(FPGA_sysclk_MHz*1.0e6);

    newFwBusGeneration = FwBusGeneration_FPGA;
    if ((FwBusGeneration_FPGA != FwBusGeneration) && !FpgaStatus.noForwardFlag)
        OnFwBusReset(FwBusGeneration_FPGA);
}